

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
          (QPodArrayOps<QLineF> *this,qsizetype i,QLineF *args)

{
  QLineF **ppQVar1;
  qsizetype *pqVar2;
  QPointF *pQVar3;
  Data *pDVar4;
  long lVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  QLineF *pQVar10;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<QLineF>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0033dd5b:
    qVar6 = (args->pt1).xp;
    qVar7 = (args->pt1).yp;
    qVar8 = (args->pt2).xp;
    qVar9 = (args->pt2).yp;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLineF>).size != 0);
    QArrayDataPointer<QLineF>::detachAndGrow
              (&this->super_QArrayDataPointer<QLineF>,where,1,(QLineF **)0x0,
               (QArrayDataPointer<QLineF> *)0x0);
    pQVar10 = createHole(this,where,i,1);
    (pQVar10->pt1).xp = qVar6;
    (pQVar10->pt1).yp = qVar7;
    (pQVar10->pt2).xp = qVar8;
    (pQVar10->pt2).yp = qVar9;
  }
  else {
    lVar5 = (this->super_QArrayDataPointer<QLineF>).size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QLineF>).ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pQVar10 = (this->super_QArrayDataPointer<QLineF>).ptr;
      qVar6 = (args->pt1).xp;
      qVar7 = (args->pt1).yp;
      qVar8 = (args->pt2).yp;
      pQVar3 = &pQVar10[lVar5].pt2;
      pQVar3->xp = (args->pt2).xp;
      pQVar3->yp = qVar8;
      pQVar10 = pQVar10 + lVar5;
      (pQVar10->pt1).xp = qVar6;
      (pQVar10->pt1).yp = qVar7;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QLineF *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QLineF>).ptr)) goto LAB_0033dd5b;
      pQVar10 = (this->super_QArrayDataPointer<QLineF>).ptr;
      qVar6 = (args->pt1).xp;
      qVar7 = (args->pt1).yp;
      qVar8 = (args->pt2).yp;
      pQVar10[-1].pt2.xp = (args->pt2).xp;
      pQVar10[-1].pt2.yp = qVar8;
      pQVar10[-1].pt1.xp = qVar6;
      pQVar10[-1].pt1.yp = qVar7;
      ppQVar1 = &(this->super_QArrayDataPointer<QLineF>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLineF>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }